

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O3

bool __thiscall
boost::ext::ut::v1_1_8::
runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16>::on<baryonyx::result>
          (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *this,
          assertion<baryonyx::result> *assertion)

{
  anon_struct_16_2_3fa459c6_for_asserts_ *paVar1;
  bool bVar2;
  assertion_fail<baryonyx::result> aStack_198;
  result local_e0;
  char *local_38;
  int local_30;
  
  bVar2 = true;
  if (this->dry_run_ == false) {
    bVar2 = (assertion->expr).status == success;
    if (bVar2) {
      baryonyx::result::result(&local_e0,&assertion->expr);
      local_30 = (assertion->location).line_;
      local_38 = (assertion->location).file_;
      paVar1 = &(this->reporter_).asserts_;
      paVar1->pass = paVar1->pass + 1;
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::~vector
                (&local_e0.solutions);
      if (local_e0.variable_name.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.variable_name.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_e0.variable_name.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e0.variable_name.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e0.affected_vars.values.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.affected_vars.values.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e0.affected_vars.values.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_e0.affected_vars.values.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_e0.affected_vars.names.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.affected_vars.names.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_e0.affected_vars.names.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e0.affected_vars.names.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      aStack_198.expr.strings.
      super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_e0.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_e0.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return true;
      }
    }
    else {
      this->fails_ = this->fails_ + 1;
      baryonyx::result::result(&aStack_198.expr,&assertion->expr);
      aStack_198.location.line_ = (assertion->location).line_;
      aStack_198.location.file_ = (assertion->location).file_;
      reporter<boost::ext::ut::v1_1_8::printer>::on<baryonyx::result>(&this->reporter_,&aStack_198);
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::~vector
                (&aStack_198.expr.solutions);
      if (aStack_198.expr.variable_name.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(aStack_198.expr.variable_name.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)aStack_198.expr.variable_name.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)aStack_198.expr.variable_name.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (aStack_198.expr.affected_vars.values.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(aStack_198.expr.affected_vars.values.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)aStack_198.expr.affected_vars.values.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)aStack_198.expr.affected_vars.values.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (aStack_198.expr.affected_vars.names.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(aStack_198.expr.affected_vars.names.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)aStack_198.expr.affected_vars.names.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)aStack_198.expr.affected_vars.names.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (aStack_198.expr.strings.
          super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return false;
      }
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (aStack_198.expr.strings.
               super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return bVar2;
}

Assistant:

[[nodiscard]] auto on(events::assertion<TExpr> assertion) -> bool {
      if (dry_run_) {
        return true;
      }

      if (static_cast<bool>(assertion.expr)) {
        reporter_.on(events::assertion_pass<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return true;
      } else {
        ++fails_;
        reporter_.on(events::assertion_fail<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return false;
      }
    }